

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::parseTernaryOp(Parser *this)

{
  Token *t;
  CompilationContext *pCVar1;
  pointer pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  Node *if_true;
  Node *if_false;
  socklen_t *in_RCX;
  sockaddr *__addr;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pNVar5 = parseNullCoalesce(this);
  if (pNVar5 != (Node *)0x0) {
    iVar4 = accept(this,0x31,__addr,in_RCX);
    if ((char)iVar4 == '\0') {
      return pNVar5;
    }
    t = this->tok;
    if_true = parseTernaryOp(this);
    if (if_true == (Node *)0x0) {
      pCVar1 = this->ctx;
      std::__cxx11::string::string((string *)&local_80,"expected expression but \'",&local_81);
      std::operator+(&local_60,&local_80,
                     token_strings
                     [(this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                      super__Vector_impl_data._M_start[this->pos].type]);
      std::operator+(&local_40,&local_60,"\' found");
      pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      CompilationContext::error
                (pCVar1,0x79,local_40._M_dataplus._M_p,pTVar2[this->pos].line,
                 (uint)pTVar2[this->pos].column);
    }
    else {
      bVar3 = expect(this,TK_COLON);
      if (bVar3) {
        if_false = parseTernaryOp(this);
        if (if_false != (Node *)0x0) {
          pNVar5 = createTernaryOpNode(this,t,pNVar5,if_true,if_false);
          return pNVar5;
        }
        pCVar1 = this->ctx;
        std::__cxx11::string::string((string *)&local_80,"expected expression but \'",&local_81);
        std::operator+(&local_60,&local_80,
                       token_strings
                       [(this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                        super__Vector_impl_data._M_start[this->pos].type]);
        std::operator+(&local_40,&local_60,"\' found");
        pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CompilationContext::error
                  (pCVar1,0x7b,local_40._M_dataplus._M_p,pTVar2[this->pos].line,
                   (uint)pTVar2[this->pos].column);
      }
      else {
        pCVar1 = this->ctx;
        std::__cxx11::string::string((string *)&local_80,"expected \':\' but \'",&local_81);
        std::operator+(&local_60,&local_80,
                       token_strings
                       [(this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                        super__Vector_impl_data._M_start[this->pos].type]);
        std::operator+(&local_40,&local_60,"\' found");
        pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CompilationContext::error
                  (pCVar1,0x7a,local_40._M_dataplus._M_p,pTVar2[this->pos].line,
                   (uint)pTVar2[this->pos].column);
      }
    }
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return (Node *)0x0;
}

Assistant:

Node * parseTernaryOp()
  {
    Node * expr = parseNullCoalesce();
    if (!expr)
      return nullptr;

    if (!accept(TK_QMARK))
      return expr;

    Token & qmarkToken = *tok;

    Node * ifTrue = parseTernaryOp();
    if (!ifTrue)
    {
      ctx.error(121, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    if (!expect(TK_COLON))
    {
      ctx.error(122, (string("expected ':' but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * ifFalse = parseTernaryOp();
    if (!ifFalse)
    {
      ctx.error(123, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * res = createTernaryOpNode(qmarkToken, expr, ifTrue, ifFalse);
    return res;
  }